

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool anon_unknown.dwarf_12ea4::DecompressPiz
               (uchar *outPtr,uchar *inPtr,size_t tmpBufSize,
               vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
               *channelInfo,int dataWidth,int numLines)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  reference pvVar9;
  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
  *pvVar10;
  size_type sVar11;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *in_RCX;
  undefined8 in_RDX;
  ushort *in_RSI;
  void *in_RDI;
  int in_R8D;
  int in_R9D;
  int n;
  PIZChannelData *cd_1;
  size_t i_2;
  int y;
  int j;
  PIZChannelData *cd;
  size_t i_1;
  int pixelSize;
  ChannelInfo *chan;
  size_t i;
  unsigned_short *tmpBufferEnd;
  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
  channelData;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  int length;
  unsigned_short maxValue;
  unsigned_short lut [65536];
  uchar *ptr;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  uchar bitmap [8192];
  size_type in_stack_fffffffffffdde78;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffdde80;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar12;
  allocator_type *in_stack_fffffffffffdde90;
  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
  *this;
  size_type in_stack_fffffffffffdde98;
  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
  *in_stack_fffffffffffddea0;
  unsigned_short *puVar13;
  undefined8 uVar14;
  undefined1 *puVar15;
  undefined4 in_stack_fffffffffffddf10;
  undefined4 in_stack_fffffffffffddf14;
  size_type sStack_220e0;
  int iStack_220d8;
  int iStack_220d4;
  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
  *pvStack_220c8;
  int in_stack_fffffffffffddf44;
  int iVar16;
  unsigned_short *in_stack_fffffffffffddf48;
  undefined8 in_stack_fffffffffffddf50;
  ulong uVar17;
  ulong __n;
  char *in_stack_fffffffffffddf58;
  reference pvVar18;
  vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
  vStack_22098;
  undefined1 auStack_22069 [25];
  undefined4 uStack_22050;
  unsigned_short uStack_2204a;
  vector<unsigned_short,_std::allocator<unsigned_short>_> avStack_22048 [5461];
  ushort *local_2048;
  uchar local_2038 [8200];
  int local_30;
  int local_2c;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *local_28;
  undefined8 local_20;
  ushort *local_18;
  void *local_10;
  byte local_1;
  
  iVar16 = (int)((ulong)in_stack_fffffffffffddf50 >> 0x20);
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar5 = IsBigEndian();
  if (bVar5) {
    local_1 = 0;
  }
  else {
    memset(local_2038,0,0x2000);
    uVar1 = *local_18;
    uVar2 = local_18[1];
    local_2048 = local_18 + 2;
    if (uVar2 < 0x2000) {
      if (uVar1 <= uVar2) {
        memcpy(local_2038 + (int)(uint)uVar1,local_2048,(long)(int)(((uint)uVar2 - (uint)uVar1) + 1)
              );
        local_2048 = (ushort *)((long)local_2048 + (long)(int)(((uint)uVar2 - (uint)uVar1) + 1));
      }
      pvVar12 = avStack_22048;
      memset(pvVar12,0,0x20000);
      uStack_2204a = reverseLutFromBitmap(local_2038,(unsigned_short *)pvVar12);
      uStack_22050 = *(undefined4 *)local_2048;
      puVar15 = auStack_22069;
      uVar14 = local_20;
      std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x127e16);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 in_stack_fffffffffffddea0,in_stack_fffffffffffdde98,
                 (allocator_type *)in_stack_fffffffffffdde90);
      std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x127e42);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                (in_stack_fffffffffffdde80,in_stack_fffffffffffdde78);
      hufUncompress(in_stack_fffffffffffddf58,iVar16,in_stack_fffffffffffddf48,
                    in_stack_fffffffffffddf44);
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::size(local_28);
      std::allocator<(anonymous_namespace)::PIZChannelData>::allocator
                ((allocator<(anonymous_namespace)::PIZChannelData> *)0x127eb2);
      std::
      vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
      ::vector(in_stack_fffffffffffddea0,in_stack_fffffffffffdde98,in_stack_fffffffffffdde90);
      std::allocator<(anonymous_namespace)::PIZChannelData>::~allocator
                ((allocator<(anonymous_namespace)::PIZChannelData> *)0x127ed8);
      pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                         (in_stack_fffffffffffdde80,in_stack_fffffffffffdde78);
      uVar17 = 0;
      while( true ) {
        __n = uVar17;
        sVar7 = std::
                vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                ::size(local_28);
        if (sVar7 <= uVar17) break;
        pvVar8 = std::
                 vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                 ::operator[](local_28,__n);
        iVar16 = 4;
        if (pvVar8->pixelType == 1) {
          iVar16 = 2;
        }
        pvVar18 = pvVar6;
        pvVar9 = std::
                 vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 ::operator[](&vStack_22098,__n);
        pvVar9->start = pvVar6;
        pvVar9 = std::
                 vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 ::operator[](&vStack_22098,__n);
        puVar13 = pvVar9->start;
        pvVar9 = std::
                 vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 ::operator[](&vStack_22098,__n);
        iVar4 = local_2c;
        pvVar9->end = puVar13;
        pvVar9 = std::
                 vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 ::operator[](&vStack_22098,__n);
        iVar3 = local_30;
        pvVar9->nx = iVar4;
        pvVar9 = std::
                 vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 ::operator[](&vStack_22098,__n);
        pvVar9->ny = iVar3;
        pvVar9 = std::
                 vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 ::operator[](&vStack_22098,__n);
        pvVar9->size = (int)((ulong)(long)iVar16 >> 1);
        pvVar9 = std::
                 vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 ::operator[](&vStack_22098,__n);
        iVar16 = pvVar9->nx;
        pvVar9 = std::
                 vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 ::operator[](&vStack_22098,__n);
        iVar3 = pvVar9->ny;
        pvVar9 = std::
                 vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 ::operator[](&vStack_22098,__n);
        pvVar6 = pvVar18 + iVar16 * iVar3 * pvVar9->size;
        uVar17 = __n + 1;
      }
      pvStack_220c8 =
           (vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
            *)0x0;
      while( true ) {
        this = pvStack_220c8;
        pvVar10 = (vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                   *)std::
                     vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                     ::size(&vStack_22098);
        if (pvVar10 <= this) break;
        pvVar9 = std::
                 vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                 ::operator[](&vStack_22098,(size_type)pvStack_220c8);
        for (iStack_220d4 = 0; iStack_220d4 < pvVar9->size; iStack_220d4 = iStack_220d4 + 1) {
          wav2Decode((unsigned_short *)CONCAT44(in_stack_fffffffffffddf14,in_stack_fffffffffffddf10)
                     ,(int)((ulong)puVar15 >> 0x20),(int)puVar15,(int)((ulong)uVar14 >> 0x20),
                     (int)uVar14,(unsigned_short)((ulong)pvVar12 >> 0x30));
        }
        pvStack_220c8 =
             (vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
              *)((long)&(pvStack_220c8->
                        super__Vector_base<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
      }
      pvVar12 = avStack_22048;
      pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at
                         (pvVar12,in_stack_fffffffffffdde78);
      applyLut((unsigned_short *)pvVar12,pvVar6,(int)local_20);
      for (iStack_220d8 = 0; iStack_220d8 < local_30; iStack_220d8 = iStack_220d8 + 1) {
        sStack_220e0 = 0;
        while( true ) {
          sVar7 = sStack_220e0;
          sVar11 = std::
                   vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                   ::size(&vStack_22098);
          if (sVar11 <= sVar7) break;
          pvVar9 = std::
                   vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
                   ::operator[](&vStack_22098,sStack_220e0);
          iVar16 = pvVar9->nx * pvVar9->size;
          memcpy(local_10,pvVar9->end,(long)iVar16 << 1);
          local_10 = (void *)((long)iVar16 * 2 + (long)local_10);
          pvVar9->end = pvVar9->end + iVar16;
          sStack_220e0 = sStack_220e0 + 1;
        }
      }
      local_1 = 1;
      std::
      vector<(anonymous_namespace)::PIZChannelData,_std::allocator<(anonymous_namespace)::PIZChannelData>_>
      ::~vector(this);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this);
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool DecompressPiz(unsigned char *outPtr, const unsigned char *inPtr, size_t tmpBufSize,
                   const std::vector<ChannelInfo> &channelInfo, int dataWidth,
                   int numLines) {
  unsigned char bitmap[BITMAP_SIZE];
  unsigned short minNonZero;
  unsigned short maxNonZero;

  if (IsBigEndian()) {
    // @todo { PIZ compression on BigEndian architecture. }
    assert(0);
    return false;
  }

  memset(bitmap, 0, BITMAP_SIZE);

  const unsigned char *ptr = inPtr;
  minNonZero = *(reinterpret_cast<const unsigned short *>(ptr));
  maxNonZero = *(reinterpret_cast<const unsigned short *>(ptr + 2));
  ptr += 4;

  if (maxNonZero >= BITMAP_SIZE) {
    return false;
  }

  if (minNonZero <= maxNonZero) {
    memcpy((char *)&bitmap[0] + minNonZero, ptr, maxNonZero - minNonZero + 1);
    ptr += maxNonZero - minNonZero + 1;
  }

  unsigned short lut[USHORT_RANGE];
  memset(lut, 0, sizeof(unsigned short) * USHORT_RANGE);
  unsigned short maxValue = reverseLutFromBitmap(bitmap, lut);

  //
  // Huffman decoding
  //

  int length;

  length = *(reinterpret_cast<const int *>(ptr));
  ptr += sizeof(int);

  std::vector<unsigned short> tmpBuffer(tmpBufSize);
  hufUncompress(reinterpret_cast<const char *>(ptr), length, &tmpBuffer.at(0),
                tmpBufSize);

  //
  // Wavelet decoding
  //

  std::vector<PIZChannelData> channelData(channelInfo.size());

  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t i = 0; i < channelInfo.size(); ++i) {
    const ChannelInfo &chan = channelInfo[i];

    int pixelSize = sizeof(int); // UINT and FLOAT
    if (chan.pixelType == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    channelData[i].start = tmpBufferEnd;
    channelData[i].end = channelData[i].start;
    channelData[i].nx = dataWidth;
    channelData[i].ny = numLines;
    // channelData[i].ys = 1;
    channelData[i].size = pixelSize / sizeof(short);

    tmpBufferEnd += channelData[i].nx * channelData[i].ny * channelData[i].size;
  }

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Decode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Expand the pixel data to their original range
  //

  applyLut(lut, &tmpBuffer.at(0), tmpBufSize);

  for (int y = 0; y < numLines; y++) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      int n = cd.nx * cd.size;
      memcpy(outPtr, cd.end, n * sizeof(unsigned short));
      outPtr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  return true;
}